

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_geometry.cpp
# Opt level: O0

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  undefined8 *in_RDI;
  int in_stack_000008cc;
  int in_stack_000008d0;
  int in_stack_000008d4;
  string *in_stack_000008d8;
  TutorialApplication *in_stack_000008e0;
  allocator local_c1;
  string local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"triangle_geometry",&local_c1);
  TutorialApplication::TutorialApplication
            (in_stack_000008e0,in_stack_000008d8,in_stack_000008d4,in_stack_000008d0,
             in_stack_000008cc);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  *in_RDI = &PTR__Tutorial_005fc5e0;
  in_RDI[0x1c] = 0x3fc000003fc00000;
  in_RDI[0x1d] = 0xbfc00000;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication(NAME,FEATURES)
    {
      /* set default camera */
      camera.from = Vec3fa(1.5f,1.5f,-1.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }